

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O3

PDir * p_dir_new(pchar *path,PError **error)

{
  char *__s;
  DIR *pDVar1;
  PDir *pPVar2;
  pchar *ppVar3;
  size_t sVar4;
  
  if (path == (pchar *)0x0) {
    p_dir_new_cold_3();
  }
  else {
    pDVar1 = opendir(path);
    if (pDVar1 == (DIR *)0x0) {
      p_dir_new_cold_2();
    }
    else {
      pPVar2 = (PDir *)p_malloc0(0x20);
      if (pPVar2 != (PDir *)0x0) {
        pPVar2->dir = (DIR *)pDVar1;
        ppVar3 = p_strdup(path);
        pPVar2->path = ppVar3;
        ppVar3 = p_strdup(path);
        pPVar2->orig_path = ppVar3;
        __s = pPVar2->path;
        sVar4 = strlen(__s);
        if ((__s[sVar4 - 1] != '\\') && (__s[sVar4 - 1] != '/')) {
          return pPVar2;
        }
        __s[sVar4 - 1] = '\0';
        return pPVar2;
      }
      p_dir_new_cold_1();
    }
  }
  return (PDir *)0x0;
}

Assistant:

P_LIB_API PDir *
p_dir_new (const pchar	*path,
	   PError	**error)
{
	PDir	*ret;
	DIR	*dir;
	pchar	*pathp;

	if (P_UNLIKELY (path == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	if (P_UNLIKELY ((dir = opendir (path)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call opendir() to open directory stream");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PDir))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for directory structure");
		closedir (dir);
		return NULL;
	}

	ret->dir       = dir;
	ret->path      = p_strdup (path);
	ret->orig_path = p_strdup (path);

	pathp = ret->path + strlen (ret->path) - 1;

	if (*pathp == '/' || *pathp == '\\')
		*pathp = '\0';

	return ret;
}